

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_relocation.hpp
# Opt level: O3

bool __thiscall
ELFIO::relocation_section_accessor_template<ELFIO::section>::generic_get_entry_rel<ELFIO::Elf64_Rel>
          (relocation_section_accessor_template<ELFIO::section> *this,Elf_Xword index,
          Elf64_Addr *offset,Elf_Word *symbol,uint *type,Elf_Sxword *addend)

{
  elfio *peVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  
  peVar1 = this->elf_file;
  iVar3 = (*this->relocation_section->_vptr_section[0xf])();
  if (0xf < CONCAT44(extraout_var,iVar3)) {
    iVar4 = (*this->relocation_section->_vptr_section[0x18])();
    iVar5 = (*this->relocation_section->_vptr_section[0xf])();
    lVar6 = CONCAT44(extraout_var_01,iVar5) * index;
    uVar2 = *(ulong *)(CONCAT44(extraout_var_00,iVar4) + lVar6);
    bVar8 = (peVar1->convertor).need_conversion == false;
    uVar7 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
            (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
            (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    if (bVar8) {
      uVar7 = uVar2;
    }
    *offset = uVar7;
    uVar2 = *(ulong *)(CONCAT44(extraout_var_00,iVar4) + 8 + lVar6);
    uVar7 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
            (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
            (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    if (bVar8) {
      uVar7 = uVar2;
    }
    *symbol = (Elf_Word)(uVar7 >> 0x20);
    *type = (uint)uVar7;
    *addend = 0;
  }
  return 0xf < CONCAT44(extraout_var,iVar3);
}

Assistant:

bool generic_get_entry_rel( Elf_Xword   index,
                                Elf64_Addr& offset,
                                Elf_Word&   symbol,
                                unsigned&   type,
                                Elf_Sxword& addend ) const
    {
        const endianness_convertor& convertor = elf_file.get_convertor();

        if ( relocation_section->get_entry_size() < sizeof( T ) ) {
            return false;
        }
        const T* pEntry = reinterpret_cast<const T*>(
            relocation_section->get_data() +
            index * relocation_section->get_entry_size() );
        offset        = convertor( pEntry->r_offset );
        Elf_Xword tmp = convertor( pEntry->r_info );
        symbol        = get_sym_and_type<T>::get_r_sym( tmp );
        type          = get_sym_and_type<T>::get_r_type( tmp );
        addend        = 0;
        return true;
    }